

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandReadTruth(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  int c;
  int fHex;
  char *pSopCover;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = true;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"xh"), iVar2 != -1) {
    if ((iVar2 == 0x68) || (iVar2 != 0x78)) goto LAB_00338985;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (argc == globalUtilOptind + 1) {
    if (bVar1) {
      _c = Abc_SopFromTruthHex(argv[globalUtilOptind]);
    }
    else {
      _c = Abc_SopFromTruthBin(argv[globalUtilOptind]);
    }
    if ((_c == (char *)0x0) || (*_c == '\0')) {
      if (_c != (char *)0x0) {
        free(_c);
      }
      fprintf((FILE *)pAbc->Err,"Reading truth table has failed.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      pNtk_00 = Abc_NtkCreateWithNode(_c);
      if (_c != (char *)0x0) {
        free(_c);
      }
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        fprintf((FILE *)pAbc->Err,"Deriving the network has failed.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
        Abc_FrameClearVerifStatus(pAbc);
        pAbc_local._4_4_ = 0;
      }
    }
  }
  else {
LAB_00338985:
    fprintf((FILE *)pAbc->Err,"usage: read_truth [-xh] <truth>\n");
    fprintf((FILE *)pAbc->Err,"\t         creates network with node having given truth table\n");
    pcVar3 = "bin";
    if (bVar1) {
      pcVar3 = "hex";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-x     : toggles between bin and hex representation [default = %s]\n",pcVar3);
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,
            "\ttruth  : truth table with most signficant bit first (e.g. 1000 for AND(a,b))\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandReadTruth( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pSopCover;
    int fHex;
    int c;

    fHex = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "xh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'x':
                fHex ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }

    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    // convert truth table to SOP
    if ( fHex )
        pSopCover = Abc_SopFromTruthHex(argv[globalUtilOptind]);
    else
        pSopCover = Abc_SopFromTruthBin(argv[globalUtilOptind]);
    if ( pSopCover == NULL || pSopCover[0] == 0 )
    {
        ABC_FREE( pSopCover );
        fprintf( pAbc->Err, "Reading truth table has failed.\n" );
        return 1;
    }

    pNtk = Abc_NtkCreateWithNode( pSopCover );
    ABC_FREE( pSopCover );
    if ( pNtk == NULL )
    {
        fprintf( pAbc->Err, "Deriving the network has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_truth [-xh] <truth>\n" );
    fprintf( pAbc->Err, "\t         creates network with node having given truth table\n" );
    fprintf( pAbc->Err, "\t-x     : toggles between bin and hex representation [default = %s]\n", fHex? "hex":"bin" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\ttruth  : truth table with most signficant bit first (e.g. 1000 for AND(a,b))\n" );
    return 1;
}